

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

void __thiscall
doctest::anon_unknown_14::XmlReporter::subcase_start(XmlReporter *this,SubcaseSignature *in)

{
  XmlWriter *pXVar1;
  char *attribute;
  uint local_d0;
  allocator<char> local_c9;
  string local_c8;
  allocator<char> local_a1;
  string local_a0;
  allocator<char> local_79;
  string local_78;
  allocator<char> local_41;
  string local_40;
  lock_guard<std::mutex> local_20;
  lock_guard<std::mutex> lock;
  SubcaseSignature *in_local;
  XmlReporter *this_local;
  
  lock._M_device = (mutex_type *)in;
  std::lock_guard<std::mutex>::lock_guard(&local_20,&this->mutex);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"SubCase",&local_41);
  pXVar1 = XmlWriter::startElement(&this->xml,&local_40);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"name",&local_79);
  pXVar1 = XmlWriter::writeAttribute<doctest::String>(pXVar1,&local_78,(String *)lock._M_device);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"filename",&local_a1);
  attribute = skipPathFromFilename
                        ((char *)((lock._M_device)->super___mutex_base)._M_mutex.__data.__list.
                                 __prev);
  pXVar1 = XmlWriter::writeAttribute(pXVar1,&local_a0,attribute);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"line",&local_c9);
  local_d0 = line(this,*(uint *)((long)&((lock._M_device)->super___mutex_base)._M_mutex + 0x20));
  XmlWriter::writeAttribute<unsigned_int>(pXVar1,&local_c8,&local_d0);
  std::__cxx11::string::~string((string *)&local_c8);
  std::allocator<char>::~allocator(&local_c9);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator(&local_a1);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator(&local_79);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  XmlWriter::ensureTagClosed(&this->xml);
  std::lock_guard<std::mutex>::~lock_guard(&local_20);
  return;
}

Assistant:

void subcase_start(const SubcaseSignature& in) override {
            std::lock_guard<std::mutex> lock(mutex);

            xml.startElement("SubCase")
                    .writeAttribute("name", in.m_name)
                    .writeAttribute("filename", skipPathFromFilename(in.m_file))
                    .writeAttribute("line", line(in.m_line));
            xml.ensureTagClosed();
        }